

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserCtxtPtr
xmlCreatePushParserCtxt(xmlSAXHandlerPtr sax,void *user_data,char *chunk,int size,char *filename)

{
  xmlChar *pxVar1;
  xmlParserInputBufferPtr in;
  char *pcVar2;
  xmlParserInputPtr input;
  xmlChar *pxVar3;
  size_t base_00;
  size_t cur;
  size_t base;
  xmlCharEncoding enc;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr inputStream;
  xmlParserCtxtPtr ctxt;
  char *filename_local;
  int size_local;
  char *chunk_local;
  void *user_data_local;
  xmlSAXHandlerPtr sax_local;
  
  base._4_4_ = XML_CHAR_ENCODING_NONE;
  if ((chunk != (char *)0x0) && (3 < size)) {
    base._4_4_ = xmlDetectCharEncoding((uchar *)chunk,size);
  }
  in = xmlAllocParserInputBuffer(base._4_4_);
  if (in == (xmlParserInputBufferPtr)0x0) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    sax_local = (xmlSAXHandlerPtr)xmlNewSAXParserCtxt(sax,user_data);
    if ((xmlParserCtxtPtr)sax_local == (xmlParserCtxtPtr)0x0) {
      xmlErrMemory((xmlParserCtxtPtr)0x0,"creating parser: out of memory\n");
      xmlFreeParserInputBuffer(in);
      sax_local = (xmlSAXHandlerPtr)0x0;
    }
    else {
      ((xmlParserCtxtPtr)sax_local)->dictNames = 1;
      if (filename == (char *)0x0) {
        ((xmlParserCtxtPtr)sax_local)->directory = (char *)0x0;
      }
      else {
        pcVar2 = xmlParserGetDirectory(filename);
        ((xmlParserCtxtPtr)sax_local)->directory = pcVar2;
      }
      input = xmlNewInputStream((xmlParserCtxtPtr)sax_local);
      if (input == (xmlParserInputPtr)0x0) {
        xmlFreeParserCtxt((xmlParserCtxtPtr)sax_local);
        xmlFreeParserInputBuffer(in);
        sax_local = (xmlSAXHandlerPtr)0x0;
      }
      else {
        if (filename == (char *)0x0) {
          input->filename = (char *)0x0;
        }
        else {
          pxVar3 = xmlCanonicPath((xmlChar *)filename);
          input->filename = (char *)pxVar3;
          if (input->filename == (char *)0x0) {
            xmlFreeInputStream(input);
            xmlFreeParserCtxt((xmlParserCtxtPtr)sax_local);
            xmlFreeParserInputBuffer(in);
            return (xmlParserCtxtPtr)0x0;
          }
        }
        input->buf = in;
        xmlBufResetInput(input->buf->buffer,input);
        inputPush((xmlParserCtxtPtr)sax_local,input);
        if ((size == 0) || (chunk == (char *)0x0)) {
          ((xmlParserCtxtPtr)sax_local)->charset = 0;
        }
        else if ((((xmlParserCtxtPtr)sax_local)->input != (xmlParserInputPtr)0x0) &&
                (((xmlParserCtxtPtr)sax_local)->input->buf != (xmlParserInputBufferPtr)0x0)) {
          base_00 = xmlBufGetInputBase(((xmlParserCtxtPtr)sax_local)->input->buf->buffer,
                                       ((xmlParserCtxtPtr)sax_local)->input);
          pxVar3 = ((xmlParserCtxtPtr)sax_local)->input->cur;
          pxVar1 = ((xmlParserCtxtPtr)sax_local)->input->base;
          xmlParserInputBufferPush(((xmlParserCtxtPtr)sax_local)->input->buf,size,chunk);
          xmlBufSetInputBaseCur
                    (((xmlParserCtxtPtr)sax_local)->input->buf->buffer,
                     ((xmlParserCtxtPtr)sax_local)->input,base_00,(long)pxVar3 - (long)pxVar1);
        }
        if (base._4_4_ != XML_CHAR_ENCODING_NONE) {
          xmlSwitchEncoding((xmlParserCtxtPtr)sax_local,base._4_4_);
        }
      }
    }
  }
  return (xmlParserCtxtPtr)sax_local;
}

Assistant:

xmlParserCtxtPtr
xmlCreatePushParserCtxt(xmlSAXHandlerPtr sax, void *user_data,
                        const char *chunk, int size, const char *filename) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr inputStream;
    xmlParserInputBufferPtr buf;
    xmlCharEncoding enc = XML_CHAR_ENCODING_NONE;

    /*
     * plug some encoding conversion routines
     */
    if ((chunk != NULL) && (size >= 4))
	enc = xmlDetectCharEncoding((const xmlChar *) chunk, size);

    buf = xmlAllocParserInputBuffer(enc);
    if (buf == NULL) return(NULL);

    ctxt = xmlNewSAXParserCtxt(sax, user_data);
    if (ctxt == NULL) {
        xmlErrMemory(NULL, "creating parser: out of memory\n");
	xmlFreeParserInputBuffer(buf);
	return(NULL);
    }
    ctxt->dictNames = 1;
    if (filename == NULL) {
	ctxt->directory = NULL;
    } else {
        ctxt->directory = xmlParserGetDirectory(filename);
    }

    inputStream = xmlNewInputStream(ctxt);
    if (inputStream == NULL) {
	xmlFreeParserCtxt(ctxt);
	xmlFreeParserInputBuffer(buf);
	return(NULL);
    }

    if (filename == NULL)
	inputStream->filename = NULL;
    else {
	inputStream->filename = (char *)
	    xmlCanonicPath((const xmlChar *) filename);
	if (inputStream->filename == NULL) {
            xmlFreeInputStream(inputStream);
	    xmlFreeParserCtxt(ctxt);
	    xmlFreeParserInputBuffer(buf);
	    return(NULL);
	}
    }
    inputStream->buf = buf;
    xmlBufResetInput(inputStream->buf->buffer, inputStream);
    inputPush(ctxt, inputStream);

    /*
     * If the caller didn't provide an initial 'chunk' for determining
     * the encoding, we set the context to XML_CHAR_ENCODING_NONE so
     * that it can be automatically determined later
     */
    if ((size == 0) || (chunk == NULL)) {
	ctxt->charset = XML_CHAR_ENCODING_NONE;
    } else if ((ctxt->input != NULL) && (ctxt->input->buf != NULL)) {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
	size_t cur = ctxt->input->cur - ctxt->input->base;

	xmlParserInputBufferPush(ctxt->input->buf, size, chunk);

        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
#ifdef DEBUG_PUSH
	xmlGenericError(xmlGenericErrorContext, "PP: pushed %d\n", size);
#endif
    }

    if (enc != XML_CHAR_ENCODING_NONE) {
        xmlSwitchEncoding(ctxt, enc);
    }

    return(ctxt);
}